

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O3

bool libtorrent::anon_unknown_1::extract_files
               (bdecode_node *list,file_storage *target,string *root_dir,ptrdiff_t info_offset,
               char *info_buffer,error_code *ec)

{
  bool bVar1;
  type_t tVar2;
  int iVar3;
  int i;
  error_code eVar4;
  bdecode_node local_70;
  
  tVar2 = bdecode_node::type(list);
  if (tVar2 == list_t) {
    iVar3 = bdecode_node::list_size(list);
    file_storage::reserve(target,iVar3);
    iVar3 = bdecode_node::list_size(list);
    if (0 < iVar3) {
      i = 0;
      do {
        bdecode_node::list_at(&local_70,list,i);
        bVar1 = extract_single_file(&local_70,target,root_dir,info_offset,info_buffer,false,ec);
        if (local_70.m_tokens.
            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_70.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_70.m_tokens.
                                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_70.m_tokens.
                                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (!bVar1) goto LAB_00369384;
        i = i + 1;
      } while (iVar3 != i);
    }
    file_storage::sanitize_symlinks(target);
    bVar1 = true;
  }
  else {
    eVar4 = errors::make_error_code(torrent_file_parse_failed);
    ec->val_ = eVar4.val_;
    ec->failed_ = eVar4.failed_;
    *(int3 *)&ec->field_0x5 = eVar4._5_3_;
    ec->cat_ = eVar4.cat_;
LAB_00369384:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool extract_files(bdecode_node const& list, file_storage& target
		, std::string const& root_dir, std::ptrdiff_t info_offset
		, char const* info_buffer, error_code& ec)
	{
		if (list.type() != bdecode_node::list_t)
		{
			ec = errors::torrent_file_parse_failed;
			return false;
		}
		target.reserve(list.list_size());

		for (int i = 0, end(list.list_size()); i < end; ++i)
		{
			if (!extract_single_file(list.list_at(i), target, root_dir
				, info_offset, info_buffer, false, ec))
				return false;
		}
		// this rewrites invalid symlinks to point to themselves
		target.sanitize_symlinks();
		return true;
	}